

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void fio_pubsub_on_channel_create(channel_s *ch)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [24];
  fio_engine_set__ordered_s_ *pfVar4;
  
  fio_lock(&fio_postoffice.engines.lock);
  for (pfVar4 = fio_postoffice.engines.set.ordered;
      (pfVar4 != (fio_engine_set__ordered_s_ *)0x0 &&
      (pfVar4 < fio_postoffice.engines.set.ordered + fio_postoffice.engines.set.pos));
      pfVar4 = pfVar4 + 1) {
    if (pfVar4->hash != 0) {
      uVar1 = ch->name_len;
      uVar2 = ch->name;
      auVar3._8_8_ = uVar2;
      auVar3._0_8_ = uVar1;
      auVar3._16_8_ = 0;
      (*pfVar4->obj->subscribe)(pfVar4->obj,(fio_str_info_s)(auVar3 << 0x40),ch->match);
    }
  }
  LOCK();
  fio_postoffice.engines.lock = '\0';
  UNLOCK();
  fio_cluster_inform_root_about_channel(ch,1);
  return;
}

Assistant:

static void fio_pubsub_on_channel_create(channel_s *ch) {
  fio_lock(&fio_postoffice.engines.lock);
  FIO_SET_FOR_LOOP(&fio_postoffice.engines.set, pos) {
    if (!pos->hash)
      continue;
    pos->obj->subscribe(pos->obj,
                        (fio_str_info_s){.data = ch->name, .len = ch->name_len},
                        ch->match);
  }
  fio_unlock(&fio_postoffice.engines.lock);
  fio_cluster_inform_root_about_channel(ch, 1);
}